

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_byteArray_primitive_uint64At
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  size_t sVar1;
  sysbvm_size_t sVar2;
  sysbvm_tuple_t sVar3;
  size_t index;
  size_t size;
  sysbvm_byteArray_t *array;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  sVar3 = *arguments;
  sVar1 = sysbvm_tuple_getSizeInBytes(*arguments);
  sVar2 = sysbvm_tuple_size_decode(arguments[1]);
  if (sVar1 < sVar2 + 8) {
    sysbvm_error_outOfBoundsSlotAccess();
  }
  sVar3 = sysbvm_tuple_uint64_encode(context,*(uint64_t *)(sVar3 + 0x10 + sVar2));
  return sVar3;
}

Assistant:

static sysbvm_tuple_t sysbvm_byteArray_primitive_uint64At(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_byteArray_t *array = (sysbvm_byteArray_t *)arguments[0];
    size_t size = sysbvm_tuple_getSizeInBytes(arguments[0]);
    size_t index = sysbvm_tuple_size_decode(arguments[1]);
    if(index + 8 > size) sysbvm_error_outOfBoundsSlotAccess();

    return sysbvm_tuple_uint64_encode(context, *(uint64_t*)(array->elements + index));
}